

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.h
# Opt level: O1

void __thiscall CVmObjFrameRef::get_targobj(CVmObjFrameRef *this,vm_val_t *result)

{
  long *plVar1;
  long lVar2;
  vm_obj_id_t vVar3;
  
  plVar1 = (long *)(this->super_CVmObject).ext_;
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    vVar3 = *(vm_obj_id_t *)((long)plVar1 + 0x3c);
  }
  else {
    vVar3 = 0;
    if (*(int *)(lVar2 + -0xa0) != 1) {
      vVar3 = *(vm_obj_id_t *)(lVar2 + -0x98);
    }
  }
  result->typ = VM_OBJ;
  (result->val).obj = vVar3;
  if (vVar3 != 0) {
    return;
  }
  result->typ = VM_NIL;
  return;
}

Assistant:

vm_frameref_ext *get_ext() const { return (vm_frameref_ext *)ext_; }